

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D::IfcCartesianTransformationOperator2D
          (IfcCartesianTransformationOperator2D *this)

{
  IfcCartesianTransformationOperator2D *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcCartesianTransformationOperator).field_0x78,
             "IfcCartesianTransformationOperator2D");
  IfcCartesianTransformationOperator::IfcCartesianTransformationOperator
            (&this->super_IfcCartesianTransformationOperator,&PTR_construction_vtable_24__00e43d68);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D,_0UL>::
  ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D,_0UL> *)
               &(this->super_IfcCartesianTransformationOperator).field_0x68,
               &PTR_construction_vtable_24__00e43de0);
  (this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xe43cb0;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator).field_0x78 = 0xe43d50;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xe43cd8;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xe43d00;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator).field_0x68 = 0xe43d28;
  return;
}

Assistant:

IfcCartesianTransformationOperator2D() : Object("IfcCartesianTransformationOperator2D") {}